

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O3

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  uint uVar9;
  bool bVar10;
  
  piVar8 = (int *)cpuid_basic_info(0);
  iVar3 = *piVar8;
  iVar4 = piVar8[1];
  uVar7 = piVar8[2];
  uVar6 = piVar8[3];
  if (iVar4 == 0x68747541) {
    uVar7 = uVar7 ^ 0x69746e65;
    uVar6 = uVar6 ^ 0x444d4163;
LAB_001401f7:
    if (uVar6 == 0 && uVar7 == 0) {
      puVar1 = (uint *)cpuid(0x80000000);
      if (0x80000005 < *puVar1) {
        lVar2 = cpuid(0x80000005);
        *l1 = *(int *)(lVar2 + 0xc) >> 0xe & 0xfffffc00;
        lVar2 = cpuid(0x80000006);
        iVar3 = *(int *)(lVar2 + 8);
        *l2 = *(int *)(lVar2 + 0xc) >> 6 & 0xfffffc00;
        *l3 = iVar3 * 2 & 0x1ff80000;
        return;
      }
      *l3 = 0;
      *l2 = 0;
      *l1 = 0;
      return;
    }
  }
  else {
    if (iVar4 == 0x69444d41) {
      uVar7 = uVar7 ^ 0x74656273;
      uVar6 = uVar6 ^ 0x21726574;
      goto LAB_001401f7;
    }
    if ((iVar4 == 0x756e6547) && (uVar6 == 0x6c65746e && uVar7 == 0x49656e69)) {
      if (3 < iVar3) {
        *l3 = 0;
        *l2 = 0;
        *l1 = 0;
        uVar7 = 0;
        while( true ) {
          puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
          uVar6 = *puVar1;
          uVar5 = puVar1[1];
          if (((uVar6 & 0xd) == 1) &&
             (((uVar9 = uVar6 >> 5 & 7, piVar8 = l1, uVar9 == 1 || (piVar8 = l3, uVar9 == 3)) ||
              (piVar8 = l2, uVar9 == 2)))) {
            *piVar8 = (puVar1[3] + 1) * ((uVar5 >> 0x16) + 1) *
                      ((uVar5 & 0xfff) + 1) * ((uVar5 >> 0xc & 0x3ff) + 1);
          }
          if ((uVar6 & 0xf) == 0) break;
          bVar10 = 0xe < uVar7;
          uVar7 = uVar7 + 1;
          if (bVar10) {
            return;
          }
        }
        return;
      }
      goto LAB_001402fc;
    }
  }
  if (3 < iVar3) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    uVar7 = 0;
    while( true ) {
      puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
      uVar6 = *puVar1;
      uVar5 = puVar1[1];
      if (((uVar6 & 0xd) == 1) &&
         (((uVar9 = uVar6 >> 5 & 7, piVar8 = l1, uVar9 == 1 || (piVar8 = l3, uVar9 == 3)) ||
          (piVar8 = l2, uVar9 == 2)))) {
        *piVar8 = (puVar1[3] + 1) * ((uVar5 >> 0x16) + 1) *
                  ((uVar5 & 0xfff) + 1) * ((uVar5 >> 0xc & 0x3ff) + 1);
      }
      if ((uVar6 & 0xf) == 0) break;
      bVar10 = 0xe < uVar7;
      uVar7 = uVar7 + 1;
      if (bVar10) {
        return;
      }
    }
    return;
  }
LAB_001402fc:
  if (iVar3 < 2) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    return;
  }
  queryCacheSizes_intel_codes(l1,l2,l3);
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[0];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}